

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  uint uVar4;
  int iVar5;
  pointer pcVar6;
  long lVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  long *plVar10;
  undefined1 *puVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  int *piVar13;
  uint32_t uVar14;
  size_type *psVar15;
  int iVar16;
  _Base_ptr p_Var17;
  Result *_result;
  int *piVar18;
  int iVar19;
  undefined1 *puVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  int *piVar23;
  int *piVar24;
  int iVar25;
  string err_1;
  int a;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  int local_7c;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar6 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar6 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  uVar14 = layer->_oneof_case_[0];
  puVar11 = *(undefined1 **)&layer->layer_;
  puVar20 = puVar11;
  if (uVar14 != 0x460) {
    puVar20 = Specification::_SqueezeLayerParams_default_instance_;
  }
  if (((SqueezeLayerParams *)puVar20)->squeezeall_ == false) {
    iVar16 = (((ConvolutionLayerParams *)puVar20)->kernelsize_).current_size_;
    if (iVar16 == 0) {
      plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      lVar7 = *plVar10;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c0,lVar7,plVar10[1] + lVar7);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x3c112f);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_e0.field_2._M_allocated_capacity = *psVar15;
        local_e0.field_2._8_8_ = plVar10[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar15;
        local_e0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_e0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar15) {
        local_60._16_8_ = *psVar15;
        local_60._24_8_ = plVar10[3];
        local_60._0_8_ = local_60 + 0x10;
      }
      else {
        local_60._16_8_ = *psVar15;
        local_60._0_8_ = (size_type *)*plVar10;
      }
      local_60._8_8_ = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
      if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      return __return_storage_ptr__;
    }
    p_Var2 = (_Base_ptr)(local_60 + 8);
    local_60._8_8_ = local_60._8_8_ & 0xffffffff00000000;
    iVar25 = 0;
    local_60._16_8_ = (undefined1 *)0x0;
    local_38 = 0;
    local_60._24_8_ = p_Var2;
    local_40 = p_Var2;
    if (0 < iVar16) {
      do {
        plVar10 = google::protobuf::RepeatedField<long>::Get
                            (&((ReshapeLayerParams *)puVar20)->targetshape_,iVar25);
        iVar16 = (int)*plVar10;
        local_78 = (int *)CONCAT44(local_78._4_4_,iVar16);
        p_Var8 = (_Base_ptr)local_60._16_8_;
        p_Var22 = p_Var2;
        if ((undefined1 *)local_60._16_8_ != (undefined1 *)0x0) {
          do {
            p_Var21 = p_Var22;
            p_Var17 = p_Var8;
            _Var3 = p_Var17[1]._M_color;
            p_Var22 = p_Var17;
            if ((int)_Var3 < iVar16) {
              p_Var22 = p_Var21;
            }
            p_Var8 = (&p_Var17->_M_left)[(int)_Var3 < iVar16];
          } while ((&p_Var17->_M_left)[(int)_Var3 < iVar16] != (_Base_ptr)0x0);
          if (p_Var22 != p_Var2) {
            if ((int)_Var3 < iVar16) {
              p_Var17 = p_Var21;
            }
            if ((int)p_Var17[1]._M_color <= iVar16) {
              plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
              lVar7 = *plVar10;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,lVar7,plVar10[1] + lVar7);
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_a0,0,(char *)0x0,0x3c112f);
              psVar15 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_c0.field_2._M_allocated_capacity = *psVar15;
                local_c0.field_2._8_8_ = plVar10[3];
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar15;
                local_c0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_c0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              psVar15 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_e0.field_2._M_allocated_capacity = *psVar15;
                local_e0.field_2._8_8_ = plVar10[3];
              }
              else {
                local_e0.field_2._M_allocated_capacity = *psVar15;
                local_e0._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_e0._M_string_length = plVar10[1];
              *plVar10 = (long)psVar15;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
              goto LAB_00350de8;
            }
          }
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_60,(int *)&local_78);
        uVar14 = layer->_oneof_case_[0];
        puVar11 = *(undefined1 **)&layer->layer_;
        puVar20 = puVar11;
        if (uVar14 != 0x460) {
          puVar20 = Specification::_SqueezeLayerParams_default_instance_;
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 < (((ConvolutionLayerParams *)puVar20)->kernelsize_).current_size_);
    }
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_)) {
      uVar4 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x24);
      if (uVar14 != 0x460) {
        puVar11 = Specification::_SqueezeLayerParams_default_instance_;
      }
      iVar16 = (((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
      if ((uVar4 != 1) &&
         (*(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) + iVar16 != uVar4)) {
        plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar7 = *plVar10;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_a0,lVar7,plVar10[1] + lVar7);
        std::operator+(&local_c0,"Squeeze Layer \'",&local_a0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e0.field_2._M_allocated_capacity = *psVar15;
          local_e0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar15;
          local_e0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_e0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
LAB_00350de8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
LAB_00350f88:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_60);
        return __return_storage_ptr__;
      }
      local_78 = (int *)0x0;
      iStack_70._M_current = (int *)0x0;
      local_68 = (int *)0x0;
      iVar25 = 0;
      do {
        puVar11 = Specification::_SqueezeLayerParams_default_instance_;
        if (layer->_oneof_case_[0] == 0x460) {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        plVar10 = google::protobuf::RepeatedField<long>::Get
                            (&((ReshapeLayerParams *)puVar11)->targetshape_,iVar25);
        local_7c = ((int)*plVar10 >> 0x1f & uVar4) + (int)*plVar10;
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_78,iStack_70._M_current,&local_7c);
        if (_Var12._M_current != iStack_70._M_current) {
          plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar7 = *plVar10;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_a0,lVar7,plVar10[1] + lVar7);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x3c112f);
          psVar15 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_c0.field_2._M_allocated_capacity = *psVar15;
            local_c0.field_2._8_8_ = plVar10[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *psVar15;
            local_c0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_c0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          psVar15 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_e0.field_2._M_allocated_capacity = *psVar15;
            local_e0.field_2._8_8_ = plVar10[3];
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar15;
            local_e0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_e0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
          goto LAB_00350f26;
        }
        if (_Var12._M_current == local_68) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_7c);
        }
        else {
          *iStack_70._M_current = local_7c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        iVar25 = iVar25 + 1;
      } while (iVar16 != iVar25);
      piVar18 = local_78 + 1;
      iVar16 = *local_78;
      piVar13 = local_78;
      piVar23 = local_78;
      piVar24 = piVar18;
      iVar25 = iVar16;
      if (piVar18 != iStack_70._M_current && local_78 != iStack_70._M_current) {
        do {
          iVar5 = *piVar24;
          iVar19 = iVar25;
          if (iVar25 <= iVar5) {
            iVar19 = iVar5;
          }
          if (iVar25 < iVar5) {
            piVar23 = piVar24;
          }
          piVar24 = piVar24 + 1;
          iVar25 = iVar19;
        } while (piVar24 != iStack_70._M_current);
        iVar25 = *piVar23;
        do {
          if (*piVar18 < iVar16) {
            piVar13 = piVar18;
            iVar16 = *piVar18;
          }
          piVar18 = piVar18 + 1;
        } while (piVar18 != iStack_70._M_current);
      }
      if (((int)uVar4 <= iVar25) || (bVar9 = true, *piVar13 < 0)) {
        plVar10 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar7 = *plVar10;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_a0,lVar7,plVar10[1] + lVar7);
        std::operator+(&local_c0,"Squeeze Layer \'",&local_a0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e0.field_2._M_allocated_capacity = *psVar15;
          local_e0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar15;
          local_e0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_e0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
LAB_00350f26:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        bVar9 = false;
      }
      if (local_78 != (int *)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      if (!bVar9) goto LAB_00350f88;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_60);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}